

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_instance.c
# Opt level: O1

_Bool al_set_sample_instance_pan(ALLEGRO_SAMPLE_INSTANCE *spl,float val)

{
  ALLEGRO_MIXER *mixer_00;
  char *string;
  ALLEGRO_MIXER *mixer;
  
  mixer_00 = (spl->parent).u.mixer;
  if ((mixer_00 == (ALLEGRO_MIXER *)0x0) || ((spl->parent).is_voice != true)) {
    if (((val == -1000.0) && (!NAN(val))) || (ABS(val) <= 1.0)) {
      if ((spl->pan == val) && (!NAN(spl->pan) && !NAN(val))) {
        return true;
      }
      spl->pan = val;
      if (mixer_00 == (ALLEGRO_MIXER *)0x0) {
        return true;
      }
      if (spl->mutex != (ALLEGRO_MUTEX *)0x0) {
        al_lock_mutex();
      }
      _al_kcm_mixer_rejig_sample_matrix(mixer_00,spl);
      if (spl->mutex == (ALLEGRO_MUTEX *)0x0) {
        return true;
      }
      al_unlock_mutex();
      return true;
    }
    string = "Invalid pan value";
  }
  else {
    string = "Could not set panning of sample attached to voice";
  }
  _al_set_error(0xff,string);
  return false;
}

Assistant:

bool al_set_sample_instance_pan(ALLEGRO_SAMPLE_INSTANCE *spl, float val)
{
   ASSERT(spl);

   if (spl->parent.u.ptr && spl->parent.is_voice) {
      _al_set_error(ALLEGRO_GENERIC_ERROR,
         "Could not set panning of sample attached to voice");
      return false;
   }
   if (val != ALLEGRO_AUDIO_PAN_NONE && (val < -1.0 || val > 1.0)) {
      _al_set_error(ALLEGRO_GENERIC_ERROR, "Invalid pan value");
      return false;
   }

   if (spl->pan != val) {
      spl->pan = val;

      /* If attached to a mixer already, need to recompute the sample
       * matrix to take into account the panning.
       */
      if (spl->parent.u.mixer) {
         ALLEGRO_MIXER *mixer = spl->parent.u.mixer;

         maybe_lock_mutex(spl->mutex);
         _al_kcm_mixer_rejig_sample_matrix(mixer, spl);
         maybe_unlock_mutex(spl->mutex);
      }
   }

   return true;
}